

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_every(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  JSShape *sh;
  JSValue new_target;
  JSValue this_obj;
  int iVar1;
  int iVar2;
  ulong uVar3;
  double dVar4;
  ulong uVar5;
  JSRefCountHeader *p_5;
  int64_t iVar6;
  JSValueUnion JVar7;
  JSValueUnion *pJVar8;
  int64_t iVar9;
  double idx;
  JSRefCountHeader *p;
  bool bVar10;
  JSValue func_obj;
  JSValue this_val_00;
  JSValue v;
  JSValue v_00;
  JSValue JVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValue JVar14;
  int64_t len;
  uint *local_f0;
  uint local_e8;
  JSValueUnion local_e0;
  JSValueUnion local_c8;
  int64_t local_c0;
  ulong local_b8;
  undefined4 local_b0;
  uint uStack_ac;
  undefined8 uStack_a8;
  ulong local_a0;
  JSValueUnion local_98;
  JSValueUnion *local_90;
  ulong local_88;
  ulong local_80;
  int64_t local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  int64_t local_60;
  double local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  local_c8.ptr = (void *)(local_c8 << 0x20);
  local_c0 = 3;
  pJVar8 = &argv->u;
  if ((special & 8U) != 0) {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)this_val.u.ptr = *this_val.u.ptr + 1;
    }
    iVar1 = js_typed_array_get_length_internal(ctx,this_val);
    local_b8 = (ulong)iVar1;
    if (-1 < iVar1) goto LAB_0016160c;
    goto LAB_00161675;
  }
  this_val = JS_ToObject(ctx,this_val);
  iVar1 = js_get_length64(ctx,(int64_t *)&local_b8,this_val);
  if (iVar1 != 0) goto LAB_00161675;
LAB_0016160c:
  JVar7 = (JSValueUnion)(argv->u).ptr;
  iVar9 = argv->tag;
  if (argc < 2) {
    local_90 = (JSValueUnion *)0x3;
    uVar3 = 0;
    local_98.float64 = 0.0;
  }
  else {
    local_90 = (JSValueUnion *)argv[1].tag;
    local_98.ptr = argv[1].u.ptr & 0xffffffff00000000;
    uVar3 = (ulong)argv[1].u.ptr & 0xffffffff;
  }
  iVar1 = check_function(ctx,*argv);
  if (iVar1 != 0) goto LAB_00161675;
  local_e0.float64 = 0.0;
  iVar6 = 3;
  local_f0 = (uint *)(ulong)(uint)special;
  local_80 = (ulong)(uint)special;
  iVar1 = special;
  local_78 = iVar9;
  local_70 = JVar7;
  if (0xc < (uint)special) goto switchD_0016171c_caseD_2;
  local_f0 = &switchD_0016171c::switchdataD_00178db0;
  iVar1 = (&switchD_0016171c::switchdataD_00178db0)[local_80] + 0x178db0;
  switch(local_80) {
  case 0:
  case 8:
    local_f0 = (uint *)0x1;
    local_e0.float64 = 4.94065645841247e-324;
  case 1:
  case 9:
    iVar6 = 1;
  default:
switchD_0016171c_caseD_2:
    JVar13.tag = iVar6;
    JVar13.u.float64 = local_e0.float64;
    goto LAB_001617d9;
  case 3:
    bVar10 = (long)(int)local_b8 == local_b8;
    JVar7.float64 = (double)(long)local_b8;
    if (bVar10) {
      JVar7.ptr = (void *)(local_b8 & 0xffffffff);
    }
    pJVar8 = (JSValueUnion *)0x7;
    if (bVar10) {
      pJVar8 = (JSValueUnion *)0x0;
    }
    goto LAB_001617ba;
  case 4:
    JVar7.float64 = 0.0;
    pJVar8 = (JSValueUnion *)0x0;
LAB_001617ba:
    JVar14.tag = (int64_t)pJVar8;
    JVar14.u.float64 = JVar7.float64;
    JVar13 = JS_ArraySpeciesCreate(ctx,this_val,JVar14);
    iVar1 = JVar7.int32;
    break;
  case 0xb:
    local_58 = (double)(local_b8 & 0xffffffff);
    local_50 = 0;
    JVar12.tag = (int64_t)&local_68;
    JVar12.u.float64 = 9.88131291682493e-324;
    _local_68 = this_val;
    JVar13 = js_typed_array___speciesCreate(ctx,JVar12,iVar1,(JSValue *)pJVar8);
    break;
  case 0xc:
    sh = ctx->array_shape;
    (sh->header).ref_count = (sh->header).ref_count + 1;
    JVar13 = JS_NewObjectFromShape(ctx,sh,2);
  }
  local_f0 = (uint *)((ulong)JVar13.u.ptr >> 0x20);
  if ((int)JVar13.tag != 6) {
LAB_001617d9:
    local_e0 = JVar13.u;
    local_88 = local_b8;
    if (0 < (long)local_b8) {
      local_98.float64 = local_98.float64 | uVar3;
      local_a0 = (ulong)local_e0.ptr & 0xffffffff | (long)local_f0 << 0x20;
      idx = 0.0;
      do {
        if ((special & 8U) == 0) {
          pJVar8 = &local_c8;
          dVar4 = idx;
          iVar2 = JS_TryGetPropertyInt64(ctx,this_val,(int64_t)idx,(JSValue *)pJVar8);
          iVar1 = SUB84(dVar4,0);
          if (iVar2 < 0) goto LAB_00161bdb;
          if (iVar2 != 0) goto LAB_0016184b;
        }
        else {
          _local_c8 = JS_GetPropertyInt64(ctx,this_val,(int64_t)idx);
          if (local_c8._8_4_ == 6) goto LAB_00161bdb;
LAB_0016184b:
          local_58 = (double)(long)idx;
          if ((ulong)idx >> 0x1f == 0) {
            local_50 = 0;
            local_58 = idx;
          }
          else {
            local_50 = 7;
          }
          _local_68 = _local_c8;
          local_b0 = 0;
          uStack_a8 = 3;
          this_obj.tag = (int64_t)local_90;
          this_obj.u.float64 = local_98.float64;
          new_target.tag = 3;
          new_target.u.ptr = (void *)((ulong)uStack_ac << 0x20);
          func_obj.tag = local_78;
          func_obj.u.float64 = local_70.float64;
          JVar7 = local_98;
          pJVar8 = local_90;
          _local_48 = this_val;
          JVar12 = JS_CallInternal(ctx,func_obj,this_obj,new_target,3,(JSValue *)&local_68,2);
          iVar1 = JVar7.int32;
          if ((uint)JVar12.tag == 6) goto LAB_00161bdb;
          if ((uint)special < 0xd) {
            JVar13 = (JSValue)(*(code *)(&DAT_00178de4 + *(int *)(&DAT_00178de4 + local_80 * 4)))();
            return JVar13;
          }
          if (0xfffffff4 < (uint)JVar12.tag) {
            iVar1 = *JVar12.u.ptr;
            *(int *)JVar12.u.ptr = iVar1 + -1;
            if (iVar1 < 2) {
              __JS_FreeValueRT(ctx->rt,JVar12);
            }
          }
          if (0xfffffff4 < local_c8._8_4_) {
            iVar2 = *local_c8.ptr;
            iVar1 = iVar2 + -1;
            *(int *)local_c8.ptr = iVar1;
            if (iVar2 < 2) {
              __JS_FreeValueRT(ctx->rt,_local_c8);
            }
          }
          local_c8.ptr = (void *)(local_c8 << 0x20);
          local_c0 = 3;
        }
        idx = (double)((long)idx + 1);
      } while ((long)idx < (long)local_88);
    }
    if (special != 0xc) {
LAB_00161c6e:
      iVar9 = JVar13.tag;
      local_e0 = JVar13.u;
      if (0xfffffff4 < local_c8._8_4_) {
        iVar1 = *local_c8.ptr;
        *(int *)local_c8.ptr = iVar1 + -1;
        if (iVar1 < 2) {
          __JS_FreeValueRT(ctx->rt,_local_c8);
        }
      }
      if ((0xfffffff4 < (uint)this_val.tag) &&
         (iVar1 = *this_val.u.ptr, *(int *)this_val.u.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,this_val);
      }
      uVar5 = (long)local_f0 << 0x20;
      uVar3 = (ulong)local_e0.ptr & 0xffffffff;
      goto LAB_001616c5;
    }
    local_58 = 0.0;
    local_50 = 0;
    this_val_00.tag = (int64_t)&local_68;
    this_val_00.u.float64 = 9.88131291682493e-324;
    _local_68 = this_val;
    JVar12 = js_typed_array___speciesCreate(ctx,this_val_00,iVar1,(JSValue *)pJVar8);
    if ((int)JVar12.tag != 6) {
      JVar7.ptr = (void *)((ulong)local_e0.ptr & 0xffffffff | (long)local_f0 << 0x20);
      local_60 = JVar13.tag;
      local_68.ptr = JVar7.ptr;
      JVar14 = JS_Invoke(ctx,JVar12,0x42,1,(JSValue *)&local_68);
      iVar1 = check_exception_free(ctx,JVar14);
      if (iVar1 == 0) {
        local_e8 = (uint)JVar13.tag;
        if ((0xfffffff4 < local_e8) &&
           (iVar1 = *JVar7.ptr, *(int *)JVar7.ptr = iVar1 + -1, iVar1 < 2)) {
          v_00.tag = JVar13.tag;
          v_00.u.ptr = JVar7.ptr;
          __JS_FreeValueRT(ctx->rt,v_00);
        }
        local_f0 = (uint *)((ulong)JVar12.u.ptr >> 0x20);
        JVar13 = JVar12;
        goto LAB_00161c6e;
      }
    }
  }
LAB_00161bdb:
  local_e0 = JVar13.u;
  if (0xfffffff4 < (uint)JVar13.tag) {
    v.u.ptr = (void *)((ulong)local_e0.ptr & 0xffffffff | (long)local_f0 << 0x20);
    iVar1 = *v.u.ptr;
    *(int *)v.u.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      v.tag = JVar13.tag;
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
LAB_00161675:
  if (0xfffffff4 < local_c8._8_4_) {
    iVar1 = *local_c8.ptr;
    *(int *)local_c8.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_c8);
    }
  }
  iVar9 = 6;
  if ((0xfffffff4 < (uint)this_val.tag) &&
     (iVar1 = *this_val.u.ptr, *(int *)this_val.u.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,this_val);
  }
  uVar3 = 0;
  uVar5 = 0;
LAB_001616c5:
  JVar11.u.ptr = (void *)(uVar3 | uVar5);
  JVar11.tag = iVar9;
  return JVar11;
}

Assistant:

static JSValue js_array_every(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, res, ret;
    JSValueConst args[3];
    JSValueConst func, this_arg;
    int64_t len, k, n;
    int present;

    ret = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];
    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];
        
    if (check_function(ctx, func))
        goto exception;

    switch (special) {
    case special_every:
    case special_every | special_TA:
        ret = JS_TRUE;
        break;
    case special_some:
    case special_some | special_TA:
        ret = JS_FALSE;
        break;
    case special_map:
        /* XXX: JS_ArraySpeciesCreate should take int64_t */
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt64(ctx, len));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter:
        ret = JS_ArraySpeciesCreate(ctx, obj, JS_NewInt32(ctx, 0));
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_map | special_TA:
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, len);
        ret = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(ret))
            goto exception;
        break;
    case special_filter | special_TA:
        ret = JS_NewArray(ctx);
        if (JS_IsException(ret))
            goto exception;
        break;
    }
    n = 0;

    for(k = 0; k < len; k++) {
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = val;
            args[1] = index_val;
            args[2] = obj;
            res = JS_Call(ctx, func, this_arg, 3, args);
            JS_FreeValue(ctx, index_val);
            if (JS_IsException(res))
                goto exception;
            switch (special) {
            case special_every:
            case special_every | special_TA:
                if (!JS_ToBoolFree(ctx, res)) {
                    ret = JS_FALSE;
                    goto done;
                }
                break;
            case special_some:
            case special_some | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    ret = JS_TRUE;
                    goto done;
                }
                break;
            case special_map:
                if (JS_DefinePropertyValueInt64(ctx, ret, k, res,
                                                JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_map | special_TA:
                if (JS_SetPropertyValue(ctx, ret, JS_NewInt32(ctx, k), res, JS_PROP_THROW) < 0)
                    goto exception;
                break;
            case special_filter:
            case special_filter | special_TA:
                if (JS_ToBoolFree(ctx, res)) {
                    if (JS_DefinePropertyValueInt64(ctx, ret, n++, JS_DupValue(ctx, val),
                                                    JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                        goto exception;
                }
                break;
            default:
                JS_FreeValue(ctx, res);
                break;
            }
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
        }
    }
done:
    if (special == (special_filter | special_TA)) {
        JSValue arr;
        args[0] = obj;
        args[1] = JS_NewInt32(ctx, n);
        arr = js_typed_array___speciesCreate(ctx, JS_UNDEFINED, 2, args);
        if (JS_IsException(arr))
            goto exception;
        args[0] = ret;
        res = JS_Invoke(ctx, arr, JS_ATOM_set, 1, args);
        if (check_exception_free(ctx, res))
            goto exception;
        JS_FreeValue(ctx, ret);
        ret = arr;
    }
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return ret;

exception:
    JS_FreeValue(ctx, ret);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}